

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_stream_parser.cc
# Opt level: O1

TokenType __thiscall
google::protobuf::util::converter::JsonStreamParser::GetNextTokenType(JsonStreamParser *this)

{
  converter cVar1;
  converter *this_00;
  bool bVar2;
  TokenType TVar3;
  int iVar4;
  size_t extraout_RDX;
  size_t sVar5;
  long lVar6;
  StringPiece input;
  
  SkipWhitespace(this);
  iVar4 = (int)(this->p_).length_;
  if (iVar4 == 0) {
    TVar3 = UNKNOWN;
  }
  else {
    lVar6 = (long)iVar4;
    if (lVar6 < 0) {
      __assert_fail("len >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/stubs/stringpiece.h"
                    ,0xe6,
                    "google::protobuf::StringPiece::StringPiece(const char *, stringpiece_ssize_type)"
                   );
    }
    this_00 = (converter *)(this->p_).ptr_;
    cVar1 = *this_00;
    TVar3 = BEGIN_STRING;
    if ((cVar1 != (converter)0x22) && (cVar1 != (converter)0x27)) {
      if ((cVar1 == (converter)0x2d) || ((byte)((char)cVar1 - 0x30U) < 10)) {
        TVar3 = BEGIN_NUMBER;
      }
      else {
        if (((long)DAT_003d4030 <= lVar6) &&
           (iVar4 = bcmp(this_00,kKeywordTrue,DAT_003d4030), iVar4 == 0)) {
          return BEGIN_TRUE;
        }
        if (((long)DAT_003d4040 <= lVar6) &&
           (iVar4 = bcmp(this_00,kKeywordFalse,DAT_003d4040), iVar4 == 0)) {
          return BEGIN_FALSE;
        }
        sVar5 = DAT_003d4050;
        if (((long)DAT_003d4050 <= lVar6) &&
           (iVar4 = bcmp(this_00,kKeywordNull,DAT_003d4050), sVar5 = extraout_RDX, iVar4 == 0)) {
          return BEGIN_NULL;
        }
        if ((byte)cVar1 < 0x5d) {
          if (cVar1 == (converter)0x2c) {
            return VALUE_SEPARATOR;
          }
          if (cVar1 == (converter)0x3a) {
            return ENTRY_SEPARATOR;
          }
          if (cVar1 == (converter)0x5b) {
            return BEGIN_ARRAY;
          }
        }
        else {
          if (cVar1 == (converter)0x5d) {
            return END_ARRAY;
          }
          if (cVar1 == (converter)0x7b) {
            return BEGIN_OBJECT;
          }
          if (cVar1 == (converter)0x7d) {
            return END_OBJECT;
          }
        }
        input.length_ = sVar5;
        input.ptr_ = (char *)(this->p_).length_;
        bVar2 = MatchKey(this_00,input);
        TVar3 = UNKNOWN - bVar2;
      }
    }
  }
  return TVar3;
}

Assistant:

JsonStreamParser::TokenType JsonStreamParser::GetNextTokenType() {
  SkipWhitespace();

  int size = p_.size();
  if (size == 0) {
    // If we ran out of data, report unknown and we'll place the previous parse
    // type onto the stack and try again when we have more data.
    return UNKNOWN;
  }
  // TODO(sven): Split this method based on context since different contexts
  // support different tokens. Would slightly speed up processing?
  const char* data = p_.data();
  StringPiece data_view = StringPiece(data, size);
  if (*data == '\"' || *data == '\'') return BEGIN_STRING;
  if (*data == '-' || ('0' <= *data && *data <= '9')) {
    return BEGIN_NUMBER;
  }
  if (size >= kKeywordTrue.length() &&
      HasPrefixString(data_view, kKeywordTrue)) {
    return BEGIN_TRUE;
  }
  if (size >= kKeywordFalse.length() &&
      HasPrefixString(data_view, kKeywordFalse)) {
    return BEGIN_FALSE;
  }
  if (size >= kKeywordNull.length() &&
      HasPrefixString(data_view, kKeywordNull)) {
    return BEGIN_NULL;
  }
  if (*data == '{') return BEGIN_OBJECT;
  if (*data == '}') return END_OBJECT;
  if (*data == '[') return BEGIN_ARRAY;
  if (*data == ']') return END_ARRAY;
  if (*data == ':') return ENTRY_SEPARATOR;
  if (*data == ',') return VALUE_SEPARATOR;
  if (MatchKey(p_)) {
    return BEGIN_KEY;
  }

  // We don't know that we necessarily have an invalid token here, just that we
  // can't parse what we have so far. So we don't report an error and just
  // return UNKNOWN so we can try again later when we have more data, or if we
  // finish and we have leftovers.
  return UNKNOWN;
}